

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

uint uv__kernel_version(void)

{
  int iVar1;
  char *__s;
  uint patch;
  uint minor;
  uint major;
  char v_sig [256];
  utsname u;
  uint local_2a4;
  int local_2a0;
  int local_29c;
  char local_298 [266];
  utsname local_18e;
  
  if (uv__kernel_version::cached_version != 0) {
    return uv__kernel_version::cached_version;
  }
  iVar1 = uv__slurp("/proc/version_signature",local_298,0x100);
  if ((iVar1 != 0) ||
     (iVar1 = sscanf(local_298,"Ubuntu %*s %u.%u.%u",&local_29c,&local_2a0,&local_2a4), iVar1 != 3))
  {
    iVar1 = uname(&local_18e);
    if (iVar1 == -1) {
      return 0;
    }
    __s = strstr(local_18e.version,"Debian ");
    if ((__s == (char *)0x0) ||
       (iVar1 = sscanf(__s,"Debian %u.%u.%u",&local_29c,&local_2a0,&local_2a4), iVar1 != 3)) {
      iVar1 = sscanf(local_18e.release,"%u.%u.%u",&local_29c,&local_2a0,&local_2a4);
      if (iVar1 != 3) {
        return 0;
      }
      if ((local_29c == 2) && (local_2a0 == 6)) {
        if (local_2a4 < 0x3c) {
          if (local_2a4 < 0x28) goto LAB_001f1773;
          local_29c = 3;
          local_2a0 = local_2a4 - 0x28;
        }
        else {
          local_29c = 4;
          local_2a0 = local_2a4 - 0x3c;
        }
        local_2a4 = 0;
      }
    }
  }
LAB_001f1773:
  uv__kernel_version::cached_version = local_2a0 * 0x100 + local_29c * 0x10000 + local_2a4;
  return uv__kernel_version::cached_version;
}

Assistant:

unsigned uv__kernel_version(void) {
  static _Atomic unsigned cached_version;
  struct utsname u;
  unsigned version;
  unsigned major;
  unsigned minor;
  unsigned patch;
  char v_sig[256];
  char* needle;

  version = atomic_load_explicit(&cached_version, memory_order_relaxed);
  if (version != 0)
    return version;

  /* Check /proc/version_signature first as it's the way to get the mainline
   * kernel version in Ubuntu. The format is:
   *   Ubuntu ubuntu_kernel_version mainline_kernel_version
   * For example:
   *   Ubuntu 5.15.0-79.86-generic 5.15.111
   */
  if (0 == uv__slurp("/proc/version_signature", v_sig, sizeof(v_sig)))
    if (3 == sscanf(v_sig, "Ubuntu %*s %u.%u.%u", &major, &minor, &patch))
      goto calculate_version;

  if (-1 == uname(&u))
    return 0;

  /* In Debian we need to check `version` instead of `release` to extract the
   * mainline kernel version. This is an example of how it looks like:
   *  #1 SMP Debian 5.10.46-4 (2021-08-03)
   */
  needle = strstr(u.version, "Debian ");
  if (needle != NULL)
    if (3 == sscanf(needle, "Debian %u.%u.%u", &major, &minor, &patch))
      goto calculate_version;

  if (3 != sscanf(u.release, "%u.%u.%u", &major, &minor, &patch))
    return 0;

  /* Handle it when the process runs under the UNAME26 personality:
   *
   * - kernels >= 3.x identify as 2.6.40+x
   * - kernels >= 4.x identify as 2.6.60+x
   *
   * UNAME26 is a poorly conceived hack that doesn't let us distinguish
   * between 4.x kernels and 5.x/6.x kernels so we conservatively assume
   * that 2.6.60+x means 4.x.
   *
   * Fun fact of the day: it's technically possible to observe the actual
   * kernel version for a brief moment because uname() first copies out the
   * real release string before overwriting it with the backcompat string.
   */
  if (major == 2 && minor == 6) {
    if (patch >= 60) {
      major = 4;
      minor = patch - 60;
      patch = 0;
    } else if (patch >= 40) {
      major = 3;
      minor = patch - 40;
      patch = 0;
    }
  }

calculate_version:
  version = major * 65536 + minor * 256 + patch;
  atomic_store_explicit(&cached_version, version, memory_order_relaxed);

  return version;
}